

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void __thiscall
obx::BoxTypeless::BoxTypeless(BoxTypeless *this,Store *store,obx_schema_id entityTypeId)

{
  OBX_store *pOVar1;
  OBX_box *pOVar2;
  char *contextPrefix;
  __cxx11 local_60 [32];
  string local_40 [8];
  string msg;
  obx_schema_id entityTypeId_local;
  Store *store_local;
  BoxTypeless *this_local;
  
  this->store_ = store;
  pOVar1 = Store::cPtr(store);
  pOVar2 = (OBX_box *)obx_box(pOVar1,entityTypeId);
  this->cBox_ = pOVar2;
  this->entityTypeId_ = entityTypeId;
  if (this->cBox_ == (OBX_box *)0x0) {
    std::__cxx11::to_string(local_60,this->entityTypeId_);
    std::operator+((char *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Can not create box for entity type ID ");
    std::__cxx11::string::~string((string *)local_60);
    pOVar2 = this->cBox_;
    contextPrefix = (char *)std::__cxx11::string::c_str();
    internal::checkPtrOrThrow(pOVar2,contextPrefix);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

BoxTypeless(Store& store, obx_schema_id entityTypeId)
        : store_(store), cBox_(obx_box(store.cPtr(), entityTypeId)), entityTypeId_(entityTypeId) {
        if (cBox_ == nullptr) {
            std::string msg = "Can not create box for entity type ID " + std::to_string(entityTypeId_);
            internal::checkPtrOrThrow(cBox_, msg.c_str());
        }
    }